

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O1

int TeleportRead(int stream,float *samples,int numsamples)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  float fVar6;
  
  if (Teleport::GetSharedMemory()::shared == '\0') {
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      Teleport::SharedMemoryHandle::SharedMemoryHandle
                ((SharedMemoryHandle *)&Teleport::GetSharedMemory()::shared);
      __cxa_atexit(Teleport::SharedMemoryHandle::~SharedMemoryHandle,
                   &Teleport::GetSharedMemory()::shared,&__dso_handle);
      __cxa_guard_release();
    }
  }
  lVar3 = (long)stream * 0x56248 + Teleport::GetSharedMemory()::shared;
  if (0 < numsamples) {
    iVar2 = *(int *)(lVar3 + 0x20);
    iVar1 = *(int *)(lVar3 + 0x24);
    uVar4 = 0;
    do {
      fVar6 = 0.0;
      if (iVar2 != iVar1) {
        iVar5 = iVar2 + 1;
        if (iVar2 == 0x15887) {
          iVar5 = 0;
        }
        *(int *)(lVar3 + 0x20) = iVar5;
        fVar6 = *(float *)(lVar3 + 0x28 + (long)iVar2 * 4);
        iVar2 = iVar5;
      }
      samples[uVar4] = fVar6;
      uVar4 = uVar4 + 1;
    } while ((uint)numsamples != uVar4);
  }
  return *(int *)(lVar3 + 0x20);
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportRead(int stream, float* samples, int numsamples)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    for (int n = 0; n < numsamples; n++)
        if (!s.Read(samples[n]))
            samples[n] = 0.0f;
    return s.readpos;
}